

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat * __thiscall Mat::dot(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  pointer p_Var1;
  pointer p_Var2;
  pointer p_Var3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar11;
  undefined1 auVar12 [16];
  ulong uVar10;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar9 = this->c * this->r;
  if (0 < (int)uVar9) {
    p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      uVar10 = *(ulong *)((long)p_Var1 + lVar11);
      uVar4 = *(ulong *)((long)p_Var2 + lVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar4;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar10;
      lVar5 = *(long *)((long)p_Var1 + lVar11 + 8);
      lVar6 = *(long *)((long)p_Var2 + lVar11 + 8);
      *(long *)((long)p_Var3 + lVar11) = SUB168(auVar12 * auVar7,0);
      *(ulong *)((long)p_Var3 + lVar11 + 8) =
           uVar10 * lVar6 + uVar4 * lVar5 + SUB168(auVar12 * auVar7,8);
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar9 << 4 != lVar11);
  }
  uVar9 = __return_storage_ptr__->c * __return_storage_ptr__->r;
  if (0 < (int)uVar9) {
    p_Var1 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      auVar12 = __modti3(*(undefined8 *)((long)p_Var1 + lVar11),
                         *(undefined8 *)((long)p_Var1 + lVar11 + 8),0x16345785d8a0003,0);
      uVar10 = auVar12._0_8_;
      auVar8._8_8_ = auVar12._8_8_ + (ulong)(0xfe9cba87a275fffc < uVar10);
      auVar8._0_8_ = uVar10 + 0x16345785d8a0003;
      if ((ulong)(0xfe9cba87a275fffc < uVar10) <= -auVar12._8_8_ - 1U) {
        auVar8 = auVar12;
      }
      *(long *)((long)p_Var1 + lVar11) = auVar8._0_8_;
      *(long *)((long)p_Var1 + lVar11 + 8) = auVar8._8_8_;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar9 << 4 != lVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::dot(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] * a.val[i];
    }
    ret.residual();
    return ret;
}